

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O1

void __thiscall Fl_Shared_Image::~Fl_Shared_Image(Fl_Shared_Image *this)

{
  ~Fl_Shared_Image(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

Fl_Shared_Image::~Fl_Shared_Image() {
  if (name_) delete[] (char *)name_;
  if (alloc_image_) delete image_;
#if FLTK_ABI_VERSION >= 10304
  delete scaled_image_;
#endif
}